

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O0

void __thiscall
QConcatenateTablesProxyModelPrivate::slotDataChanged
          (QConcatenateTablesProxyModelPrivate *this,QModelIndex *from,QModelIndex *to,
          QList<int> *roles)

{
  long lVar1;
  int iVar2;
  QModelIndex *_t2;
  QModelIndex *in_RCX;
  QModelIndex *in_RDX;
  QModelIndex *in_RSI;
  QConcatenateTablesProxyModelPrivate *in_RDI;
  long in_FS_OFFSET;
  QConcatenateTablesProxyModel *q;
  QModelIndex myTo;
  QModelIndex myFrom;
  QModelIndex adjustedTo;
  QModelIndex *in_stack_ffffffffffffffa0;
  QConcatenateTablesProxyModel *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _t2 = (QModelIndex *)q_func(in_RDI);
  iVar2 = QModelIndex::column(in_RSI);
  if (iVar2 < in_RDI->m_columnCount) {
    iVar2 = QModelIndex::column(in_RDX);
    if (in_RDI->m_columnCount <= iVar2) {
      QModelIndex::siblingAtColumn(in_RDX,(int)((ulong)in_RCX >> 0x20));
    }
    QConcatenateTablesProxyModel::mapFromSource(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0)
    ;
    QConcatenateTablesProxyModel::mapFromSource
              ((QConcatenateTablesProxyModel *)&DAT_aaaaaaaaaaaaaaaa,
               (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa);
    QAbstractItemModel::dataChanged((QAbstractItemModel *)in_RDX,in_RCX,_t2,(QList<int> *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QConcatenateTablesProxyModelPrivate::slotDataChanged(const QModelIndex &from,
                                                          const QModelIndex &to,
                                                          const QList<int> &roles)
{
    Q_Q(QConcatenateTablesProxyModel);
    Q_ASSERT(from.isValid());
    Q_ASSERT(to.isValid());
    if (from.column() >= m_columnCount)
        return;
    QModelIndex adjustedTo = to;
    if (to.column() >= m_columnCount)
        adjustedTo = to.siblingAtColumn(m_columnCount - 1);
    const QModelIndex myFrom = q->mapFromSource(from);
    Q_ASSERT(q->checkIndex(myFrom, QAbstractItemModel::CheckIndexOption::IndexIsValid));
    const QModelIndex myTo = q->mapFromSource(adjustedTo);
    Q_ASSERT(q->checkIndex(myTo, QAbstractItemModel::CheckIndexOption::IndexIsValid));
    emit q->dataChanged(myFrom, myTo, roles);
}